

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# putkey.c
# Opt level: O0

int ffphtb(fitsfile *fptr,LONGLONG naxis1,LONGLONG naxis2,int tfields,char **ttype,long *tbcol,
          char **tform,char **tunit,char *extnmx,int *status)

{
  size_t sVar1;
  int in_ECX;
  long in_RDX;
  long in_RSI;
  int *in_RDI;
  long in_R8;
  long *in_R9;
  long in_stack_00000008;
  char extnm [71];
  char comm [73];
  char name [75];
  char tfmt [30];
  long rowlen;
  int gotmem;
  int ncols;
  int ii;
  undefined4 in_stack_fffffffffffffe90;
  int in_stack_fffffffffffffe94;
  char cVar2;
  undefined7 in_stack_fffffffffffffe99;
  long *in_stack_fffffffffffffea0;
  long *in_stack_fffffffffffffea8;
  undefined4 in_stack_fffffffffffffeb0;
  int in_stack_fffffffffffffeb4;
  char **in_stack_fffffffffffffeb8;
  int in_stack_fffffffffffffec0;
  int in_stack_fffffffffffffec4;
  char *in_stack_fffffffffffffec8;
  char local_118 [8];
  int *in_stack_fffffffffffffef0;
  int *in_stack_fffffffffffffef8;
  int in_stack_ffffffffffffff04;
  fitsfile *in_stack_ffffffffffffff08;
  int *in_stack_ffffffffffffff28;
  char *in_stack_ffffffffffffff30;
  char *in_stack_ffffffffffffff38;
  char *in_stack_ffffffffffffff40;
  fitsfile *in_stack_ffffffffffffff48;
  char local_78 [40];
  long local_50;
  int local_44;
  int local_40;
  int local_3c;
  long *local_38;
  long local_30;
  int local_24;
  long local_20;
  long local_18;
  int *local_10;
  int local_4;
  
  local_44 = 0;
  local_38 = in_R9;
  local_30 = in_R8;
  local_24 = in_ECX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  if (*in_RDI != *(int *)(*(long *)(in_RDI + 2) + 0x54)) {
    ffmahd(in_stack_ffffffffffffff08,in_stack_ffffffffffffff04,in_stack_fffffffffffffef8,
           in_stack_fffffffffffffef0);
  }
  if (*(int *)extnm._16_8_ < 1) {
    if (*(long *)(*(long *)(local_10 + 2) + 0x70) ==
        *(long *)(*(long *)(*(long *)(local_10 + 2) + 0x68) +
                 (long)*(int *)(*(long *)(local_10 + 2) + 0x54) * 8)) {
      if (local_18 < 0) {
        *(undefined4 *)extnm._16_8_ = 0xd9;
        local_4 = 0xd9;
      }
      else if (local_20 < 0) {
        *(undefined4 *)extnm._16_8_ = 0xda;
        local_4 = 0xda;
      }
      else if ((local_24 < 0) || (999 < local_24)) {
        *(undefined4 *)extnm._16_8_ = 0xd8;
        local_4 = 0xd8;
      }
      else {
        cVar2 = '\0';
        if (extnm._8_8_ != 0) {
          strncat(&stack0xfffffffffffffe98,(char *)extnm._8_8_,0x46);
        }
        local_50 = local_18;
        if (((local_38 == (long *)0x0) || (*local_38 == 0)) || ((local_18 == 0 && (local_24 != 0))))
        {
          in_stack_fffffffffffffe94 = local_24;
          if (local_24 < 5) {
            in_stack_fffffffffffffe94 = 5;
          }
          local_40 = in_stack_fffffffffffffe94;
          local_38 = (long *)calloc((long)in_stack_fffffffffffffe94,8);
          if (local_38 != (long *)0x0) {
            local_44 = 1;
            ffgabc(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb4,
                   in_stack_fffffffffffffea8,in_stack_fffffffffffffea0,
                   (int *)CONCAT71(in_stack_fffffffffffffe99,cVar2));
          }
        }
        ffpkys(in_stack_ffffffffffffff48,in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,
               in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
        ffpkyj(in_stack_ffffffffffffff48,in_stack_ffffffffffffff40,
               (LONGLONG)in_stack_ffffffffffffff38,in_stack_ffffffffffffff30,
               in_stack_ffffffffffffff28);
        ffpkyj(in_stack_ffffffffffffff48,in_stack_ffffffffffffff40,
               (LONGLONG)in_stack_ffffffffffffff38,in_stack_ffffffffffffff30,
               in_stack_ffffffffffffff28);
        ffpkyj(in_stack_ffffffffffffff48,in_stack_ffffffffffffff40,
               (LONGLONG)in_stack_ffffffffffffff38,in_stack_ffffffffffffff30,
               in_stack_ffffffffffffff28);
        ffpkyj(in_stack_ffffffffffffff48,in_stack_ffffffffffffff40,
               (LONGLONG)in_stack_ffffffffffffff38,in_stack_ffffffffffffff30,
               in_stack_ffffffffffffff28);
        ffpkyj(in_stack_ffffffffffffff48,in_stack_ffffffffffffff40,
               (LONGLONG)in_stack_ffffffffffffff38,in_stack_ffffffffffffff30,
               in_stack_ffffffffffffff28);
        ffpkyj(in_stack_ffffffffffffff48,in_stack_ffffffffffffff40,
               (LONGLONG)in_stack_ffffffffffffff38,in_stack_ffffffffffffff30,
               in_stack_ffffffffffffff28);
        ffpkyj(in_stack_ffffffffffffff48,in_stack_ffffffffffffff40,
               (LONGLONG)in_stack_ffffffffffffff38,in_stack_ffffffffffffff30,
               in_stack_ffffffffffffff28);
        for (local_3c = 0; local_3c < local_24; local_3c = local_3c + 1) {
          if (**(char **)(local_30 + (long)local_3c * 8) != '\0') {
            snprintf(local_118,0x49,"label for field %3d",(ulong)(local_3c + 1));
            ffkeyn(in_stack_fffffffffffffec8,in_stack_fffffffffffffec4,
                   (char *)in_stack_fffffffffffffeb8,
                   (int *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0));
            ffpkys(in_stack_ffffffffffffff48,in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,
                   in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
          }
          if ((local_38[local_3c] < 1) || (local_50 < local_38[local_3c])) {
            *(undefined4 *)extnm._16_8_ = 0xea;
          }
          snprintf(local_118,0x49,"beginning column of field %3d",(ulong)(local_3c + 1));
          ffkeyn(in_stack_fffffffffffffec8,in_stack_fffffffffffffec4,
                 (char *)in_stack_fffffffffffffeb8,
                 (int *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0));
          ffpkyj(in_stack_ffffffffffffff48,in_stack_ffffffffffffff40,
                 (LONGLONG)in_stack_ffffffffffffff38,in_stack_ffffffffffffff30,
                 in_stack_ffffffffffffff28);
          sVar1 = strlen(*(char **)(in_stack_00000008 + (long)local_3c * 8));
          if (0x1d < sVar1) {
            ffpmsg((char *)0x240813);
            *(undefined4 *)extnm._16_8_ = 0x105;
            break;
          }
          strcpy(local_78,*(char **)(in_stack_00000008 + (long)local_3c * 8));
          ffupch((char *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90));
          ffkeyn(in_stack_fffffffffffffec8,in_stack_fffffffffffffec4,
                 (char *)in_stack_fffffffffffffeb8,
                 (int *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0));
          ffpkys(in_stack_ffffffffffffff48,in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,
                 in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
          if (((extnm._0_8_ != 0) && (*(long *)(extnm._0_8_ + (long)local_3c * 8) != 0)) &&
             (**(char **)(extnm._0_8_ + (long)local_3c * 8) != '\0')) {
            ffkeyn(in_stack_fffffffffffffec8,in_stack_fffffffffffffec4,
                   (char *)in_stack_fffffffffffffeb8,
                   (int *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0));
            ffpkys(in_stack_ffffffffffffff48,in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,
                   in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
          }
          if (0 < *(int *)extnm._16_8_) break;
        }
        if (cVar2 != '\0') {
          ffpkys(in_stack_ffffffffffffff48,in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,
                 in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
        }
        if (0 < *(int *)extnm._16_8_) {
          ffpmsg((char *)0x2409b7);
        }
        if (local_44 != 0) {
          free(local_38);
        }
        local_4 = *(int *)extnm._16_8_;
      }
    }
    else {
      *(undefined4 *)extnm._16_8_ = 0xc9;
      local_4 = 0xc9;
    }
  }
  else {
    local_4 = *(int *)extnm._16_8_;
  }
  return local_4;
}

Assistant:

int ffphtb(fitsfile *fptr,  /* I - FITS file pointer                        */
           LONGLONG naxis1,     /* I - width of row in the table                */
           LONGLONG naxis2,     /* I - number of rows in the table              */
           int tfields,     /* I - number of columns in the table           */
           char **ttype,    /* I - name of each column                      */
           long *tbcol,     /* I - byte offset in row to each column        */
           char **tform,    /* I - value of TFORMn keyword for each column  */
           char **tunit,    /* I - value of TUNITn keyword for each column  */
           const char *extnmx,   /* I - value of EXTNAME keyword, if any         */
           int *status)     /* IO - error status                            */
/*
  Put required Header keywords into the ASCII TaBle:
*/
{
    int ii, ncols, gotmem = 0;
    long rowlen; /* must be 'long' because it is passed to ffgabc */
    char tfmt[30], name[FLEN_KEYWORD], comm[FLEN_COMMENT], extnm[FLEN_VALUE];

    if (fptr->HDUposition != (fptr->Fptr)->curhdu)
        ffmahd(fptr, (fptr->HDUposition) + 1, NULL, status);

    if (*status > 0)
        return(*status);
    else if ((fptr->Fptr)->headend != (fptr->Fptr)->headstart[(fptr->Fptr)->curhdu] )
        return(*status = HEADER_NOT_EMPTY);
    else if (naxis1 < 0)
        return(*status = NEG_WIDTH);
    else if (naxis2 < 0)
        return(*status = NEG_ROWS);
    else if (tfields < 0 || tfields > 999)
        return(*status = BAD_TFIELDS);
    
    extnm[0] = '\0';
    if (extnmx)
        strncat(extnm, extnmx, FLEN_VALUE-1);

    rowlen = (long) naxis1;

    if (!tbcol || !tbcol[0] || (!naxis1 && tfields)) /* spacing not defined? */
    {
      /* allocate mem for tbcol; malloc can have problems allocating small */
      /* arrays, so allocate at least 20 bytes */

      ncols = maxvalue(5, tfields);
      tbcol = (long *) calloc(ncols, sizeof(long));

      if (tbcol)
      {
        gotmem = 1;

        /* calculate width of a row and starting position of each column. */
        /* Each column will be separated by 1 blank space */
        ffgabc(tfields, tform, 1, &rowlen, tbcol, status);
      }
    }
    ffpkys(fptr, "XTENSION", "TABLE", "ASCII table extension", status);
    ffpkyj(fptr, "BITPIX", 8, "8-bit ASCII characters", status);
    ffpkyj(fptr, "NAXIS", 2, "2-dimensional ASCII table", status);
    ffpkyj(fptr, "NAXIS1", rowlen, "width of table in characters", status);
    ffpkyj(fptr, "NAXIS2", naxis2, "number of rows in table", status);
    ffpkyj(fptr, "PCOUNT", 0, "no group parameters (required keyword)", status);
    ffpkyj(fptr, "GCOUNT", 1, "one data group (required keyword)", status);
    ffpkyj(fptr, "TFIELDS", tfields, "number of fields in each row", status);

    for (ii = 0; ii < tfields; ii++) /* loop over every column */
    {
        if ( *(ttype[ii]) )  /* optional TTYPEn keyword */
        {
          snprintf(comm, FLEN_COMMENT,"label for field %3d", ii + 1);
          ffkeyn("TTYPE", ii + 1, name, status);
          ffpkys(fptr, name, ttype[ii], comm, status);
        }

        if (tbcol[ii] < 1 || tbcol[ii] > rowlen)
           *status = BAD_TBCOL;

        snprintf(comm, FLEN_COMMENT,"beginning column of field %3d", ii + 1);
        ffkeyn("TBCOL", ii + 1, name, status);
        ffpkyj(fptr, name, tbcol[ii], comm, status);

        if (strlen(tform[ii]) > 29)
        {
          ffpmsg("Error: ASCII table TFORM code is too long (ffphtb)");
          *status = BAD_TFORM;
          break;
        }
        strcpy(tfmt, tform[ii]);  /* required TFORMn keyword */
        ffupch(tfmt);
        ffkeyn("TFORM", ii + 1, name, status);
        ffpkys(fptr, name, tfmt, "Fortran-77 format of field", status);

        if (tunit)
        {
         if (tunit[ii] && *(tunit[ii]) )  /* optional TUNITn keyword */
         {
          ffkeyn("TUNIT", ii + 1, name, status);
          ffpkys(fptr, name, tunit[ii], "physical unit of field", status) ;
         }
        }

        if (*status > 0)
            break;       /* abort loop on error */
    }

    if (extnm[0])       /* optional EXTNAME keyword */
        ffpkys(fptr, "EXTNAME", extnm,
               "name of this ASCII table extension", status);

    if (*status > 0)
        ffpmsg("Failed to write ASCII table header keywords (ffphtb)");

    if (gotmem)
        free(tbcol); 

    return(*status);
}